

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.cpp
# Opt level: O0

void f_luaopen(lua_State *L,void *ud)

{
  global_State *g_00;
  TString *pTVar1;
  global_State *g;
  void *ud_local;
  lua_State *L_local;
  
  g_00 = L->l_G;
  stack_init(L,L);
  init_registry(L,g_00);
  luaS_resize(L,0x20);
  luaT_init(L);
  luaX_init(L);
  pTVar1 = luaS_newlstr(L,"not enough memory",0x11);
  g_00->memerrmsg = pTVar1;
  (g_00->memerrmsg->tsv).marked = (g_00->memerrmsg->tsv).marked | 0x20;
  g_00->gcrunning = '\x01';
  return;
}

Assistant:

static void f_luaopen (lua_State *L, void *ud) {
  global_State *g = G(L);
  UNUSED(ud);
  stack_init(L, L);  /* init stack */
  init_registry(L, g);
  luaS_resize(L, MINSTRTABSIZE);  /* initial size of string table */
  luaT_init(L);
  luaX_init(L);
  /* pre-create memory-error message */
  g->memerrmsg = luaS_newliteral(L, MEMERRMSG);
  luaS_fix(g->memerrmsg);  /* it should never be collected */
  g->gcrunning = 1;  /* allow gc */
}